

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void __thiscall SslTcpSocketImpl::Close(SslTcpSocketImpl *this)

{
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  SslConnection *this_00;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  SSL *pSVar5;
  wstring *pwVar6;
  wchar_t *pwVar7;
  __array temp;
  size_t len;
  unique_lock<std::mutex> lock;
  _Head_base<0UL,_unsigned_char_*,_false> local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
  *local_68;
  unique_lock<std::mutex> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  this->m_bCloseReq = true;
  iVar3 = (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[8])();
  if (((iVar3 == 0) &&
      (this_00 = (this->m_pSslCon)._M_t.
                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
      this_00 != (SslConnection *)0x0)) &&
     (iVar3 = OpenSSLWrapper::SslConnection::SSLGetShutdown(this_00), iVar3 < 1)) {
    local_60._M_device = &this->m_mxEnDecode;
    local_60._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_60);
    local_60._M_owns = true;
    sVar4 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (sVar4 == 0) {
      bVar2 = false;
    }
    else {
      __mutex = &(this->super_TcpSocketImpl).m_mxOutDeque;
      local_68 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                  *)&(this->super_TcpSocketImpl).m_quOutData;
      bVar2 = false;
      do {
        pSVar5 = OpenSSLWrapper::SslConnection::operator()
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl);
        __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                  (&local_50,vswprintf,0x20,L"%lu",pSVar5);
        pwVar6 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)&local_50,0,(wchar_t *)0x0,0x1344d4);
        std::__cxx11::wstring::wstring((wstring *)local_88,pwVar6);
        pwVar6 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_88);
        std::__cxx11::wstring::wstring((wstring *)local_a8,pwVar6);
        OutputDebugString((wchar_t *)local_a8[0]._M_head_impl);
        if ((long *)local_a8[0]._M_head_impl != local_98) {
          operator_delete(local_a8[0]._M_head_impl,local_98[0] * 4 + 4);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
        }
        pwVar7 = (wchar_t *)operator_new__(sVar4);
        memset(pwVar7,0,sVar4);
        local_a8[0]._M_head_impl = (uchar *)pwVar7;
        local_88[0] = (long *)OpenSSLWrapper::SslConnection::SslGetOutData
                                        ((this->m_pSslCon)._M_t.
                                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                         .
                                         super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>
                                         ._M_head_impl,(uint8_t *)pwVar7,sVar4);
        if (local_88[0] != (long *)0x0) {
          iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
          if (iVar3 != 0) {
            std::__throw_system_error(iVar3);
          }
          LOCK();
          paVar1 = &(this->super_TcpSocketImpl).m_atOutBytes;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_88[0];
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&>
                    (local_68,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              local_a8,(unsigned_long *)local_88);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          bVar2 = true;
        }
        sVar4 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        if ((wchar_t *)local_a8[0]._M_head_impl != (wchar_t *)0x0) {
          operator_delete__(local_a8[0]._M_head_impl);
        }
      } while (sVar4 != 0);
    }
    std::unique_lock<std::mutex>::unlock(&local_60);
    if (this->m_iSslInit == 1) {
      OpenSSLWrapper::SslConnection::ShutDownConnection
                ((this->m_pSslCon)._M_t.
                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
                 (int *)0x0);
      sVar4 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                        );
      if (sVar4 != 0) {
        do {
          pwVar7 = (wchar_t *)operator_new__(sVar4);
          memset(pwVar7,0,sVar4);
          local_a8[0]._M_head_impl = (uchar *)pwVar7;
          local_88[0] = (long *)OpenSSLWrapper::SslConnection::SslGetOutData
                                          ((this->m_pSslCon)._M_t.
                                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                           .
                                           super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>
                                           ._M_head_impl,(uint8_t *)pwVar7,sVar4);
          if (local_88[0] != (long *)0x0) {
            LOCK();
            paVar1 = &(this->super_TcpSocketImpl).m_atOutBytes;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_88[0];
            UNLOCK();
            bVar2 = true;
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                        *)&(this->super_TcpSocketImpl).m_quOutData,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       local_a8,(unsigned_long *)local_88);
          }
          sVar4 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl);
          if ((wchar_t *)local_a8[0]._M_head_impl != (wchar_t *)0x0) {
            operator_delete__(local_a8[0]._M_head_impl);
          }
        } while (sVar4 != 0);
      }
    }
    if (bVar2) {
      TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
  }
  TcpSocketImpl::Close(&this->super_TcpSocketImpl);
  return;
}

Assistant:

void SslTcpSocketImpl::Close()
{
    //OutputDebugString(L"SslTcpSocketImpl::Close\r\n");
    m_bCloseReq = true;

    if (GetErrorNo() == 0)  // We get here not because of an error
    {
        if (m_pSslCon != nullptr && m_pSslCon->SSLGetShutdown() < SSL_SENT_SHUTDOWN)
        {
            bool bNewData = false;
            unique_lock<mutex> lock(m_mxEnDecode);
            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                OutputDebugString(wstring(L"SslGetOutDataSize unexpected full: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }
            lock.unlock();

            if (m_iSslInit == 1)
            {
                m_pSslCon->ShutDownConnection();
                // Get the out Que of the openssl bio, the buffer is already encrypted
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
                while (nOutDataSize > 0)
                {
                    auto temp = make_unique<uint8_t[]>(nOutDataSize);
                    const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                    // Schreibt Daten in die SOCKET
                    if (len > 0)
                    {
                        m_atOutBytes += len;
                        m_quOutData.emplace_back(move(temp), len);
                        bNewData = true;
                    }
                    nOutDataSize = m_pSslCon->SslGetOutDataSize();
                }
            }

            if (bNewData == true)
                TriggerWriteThread();
        }
    }

    TcpSocketImpl::Close();
}